

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O3

property_ptr __thiscall
dtc::fdt::property::parse_dtb(property *this,input_buffer *structs,input_buffer *strings)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  property *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  property_ptr pVar2;
  
  this_01 = (property *)operator_new(0x78);
  property(this_01,structs,strings);
  (this->key)._M_dataplus._M_p = (pointer)this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<dtc::fdt::property*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->key)._M_string_length,this_01);
  _Var1._M_pi = extraout_RDX;
  if ((this->key)._M_dataplus._M_p[0x70] == '\0') {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->key)._M_string_length;
    (this->key)._M_dataplus._M_p = (pointer)0x0;
    (this->key)._M_string_length = 0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      _Var1._M_pi = extraout_RDX_00;
    }
  }
  pVar2.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  pVar2.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (property_ptr)pVar2.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

property_ptr
property::parse_dtb(input_buffer &structs, input_buffer &strings)
{
	property_ptr p(new property(structs, strings));
	if (!p->valid)
	{
		p = nullptr;
	}
	return p;
}